

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Rational * __thiscall
Matrix<Rational>::trace(Rational *__return_storage_ptr__,Matrix<Rational> *this)

{
  uint uVar1;
  matrix_error *this_00;
  uint uVar2;
  
  if (this->N == this->M) {
    Rational::Rational(__return_storage_ptr__);
    uVar1 = this->N;
    for (uVar2 = 0; uVar2 < uVar1 * uVar1; uVar2 = uVar2 + uVar1 + 1) {
      Rational::operator+=(__return_storage_ptr__,this->arr + uVar2);
      uVar1 = this->N;
    }
    return __return_storage_ptr__;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to calculate trace of a non-square matrix");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Field Matrix<Field>::trace() const
{
    if(N != M)
        throw matrix_error("Trying to calculate trace of a non-square matrix");
    Field ans;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans += arr[i];
    }
    return ans;
}